

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

uint32 __thiscall rw::MaterialList::streamGetSize(MaterialList *this)

{
  uint32 uVar1;
  int local_1c;
  int local_18;
  int32 j;
  int32 i;
  uint32 size;
  MaterialList *this_local;
  
  j = this->numMaterials * 4 + 0x10;
  local_18 = 0;
  do {
    local_1c = local_18;
    if (this->numMaterials <= local_18) {
      return j;
    }
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) {
        uVar1 = Material::streamGetSize(this->materials[local_18]);
        j = uVar1 + 0xc + j;
        break;
      }
    } while (this->materials[local_18] != this->materials[local_1c]);
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

uint32
MaterialList::streamGetSize(void)
{
	uint32 size = 12 + 4 + this->numMaterials*4;
	for(int32 i = 0; i < this->numMaterials; i++){
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j])
				goto found;
		size += 12 + this->materials[i]->streamGetSize();
		found:;
	}
	return size;
}